

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

uint __thiscall EventLoop::fireSocket(EventLoop *this,int fd,uint mode)

{
  iterator iVar1;
  unique_lock<std::mutex> locker;
  function<void_(int,_unsigned_int)> callback;
  int local_4c;
  unique_lock<std::mutex> local_48;
  function<void_(int,_unsigned_int)> local_38;
  
  local_4c = fd;
  std::unique_lock<std::mutex>::unique_lock(&local_48,&this->mMutex);
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>_>
          ::find(&(this->mSockets)._M_t,&local_4c);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->mSockets)._M_t._M_impl.super__Rb_tree_header) {
    mode = 0;
  }
  else {
    std::function<void_(int,_unsigned_int)>::function
              (&local_38,(function<void_(int,_unsigned_int)> *)&iVar1._M_node[1]._M_left);
    std::unique_lock<std::mutex>::unlock(&local_48);
    std::function<void_(int,_unsigned_int)>::operator()(&local_38,local_4c,mode);
    std::_Function_base::~_Function_base(&local_38.super__Function_base);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  return mode;
}

Assistant:

unsigned int EventLoop::fireSocket(int fd, unsigned int mode)
{
    std::unique_lock<std::mutex> locker(mMutex);
    const auto socket = mSockets.find(fd);
    if (socket != mSockets.end()) {
        const auto callback = socket->second.second;
        locker.unlock();
        RCT_CALLBACK(callback(fd, mode));
        return mode;
    }
    return 0;
}